

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::NodeTranslator
          (NodeTranslator *this,Resolver *resolver,ErrorReporter *errorReporter,Reader *decl,
          Orphan<capnp::schema::Node> *wipNodeParam,bool compileAnnotations)

{
  uint *puVar1;
  Reader decl_00;
  Builder builder;
  BuilderArena *pBVar2;
  CapTableBuilder *pCVar3;
  BrandScope *this_00;
  _func_int **startingScopeId;
  Refcounted *refcounted;
  bool bVar4;
  StructReader local_138;
  SegmentReader *local_108;
  CapTableReader *pCStack_100;
  void *local_f8;
  WirePointer *pWStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  StructBuilder local_d0;
  PointerReader local_a8;
  StructBuilder local_88;
  ListReader local_60;
  
  this->resolver = resolver;
  this->errorReporter = errorReporter;
  capnp::_::OrphanBuilder::asStruct(&local_88,&wipNodeParam->builder,(StructSize)0x60005);
  local_138.dataSize = local_88.dataSize;
  local_138.pointerCount = local_88.pointerCount;
  local_138._38_2_ = local_88._38_2_;
  local_138.data = local_88.data;
  local_138.pointers = local_88.pointers;
  local_138.segment = &(local_88.segment)->super_SegmentReader;
  local_138.capTable = &(local_88.capTable)->super_CapTableReader;
  pBVar2 = capnp::_::StructBuilder::getArena((StructBuilder *)&local_138);
  pCVar3 = capnp::_::StructBuilder::getCapTable((StructBuilder *)&local_138);
  (this->orphanage).arena = pBVar2;
  (this->orphanage).capTable = pCVar3;
  this->compileAnnotations = compileAnnotations;
  capnp::_::OrphanBuilder::asStructReader(&local_138,&wipNodeParam->builder,(StructSize)0x60005);
  if (local_138.dataSize < 0x40) {
    startingScopeId = (_func_int **)0x0;
  }
  else {
    startingScopeId = ((CapTableReader *)local_138.data)->_vptr_CapTableReader;
  }
  bVar4 = (decl->_reader).pointerCount < 8;
  local_a8.pointer = (decl->_reader).pointers + 7;
  if (bVar4) {
    local_a8.pointer = (WirePointer *)0x0;
  }
  local_a8.nestingLimit = (decl->_reader).nestingLimit;
  if (bVar4) {
    local_a8.segment._0_4_ = 0;
    local_a8.segment._4_4_ = 0;
    local_a8.capTable._0_4_ = 0;
    local_a8.capTable._4_4_ = 0;
    local_a8.nestingLimit = 0x7fffffff;
  }
  else {
    local_a8.segment._0_4_ = *(undefined4 *)&(decl->_reader).segment;
    local_a8.segment._4_4_ = *(undefined4 *)((long)&(decl->_reader).segment + 4);
    local_a8.capTable._0_4_ = *(undefined4 *)&(decl->_reader).capTable;
    local_a8.capTable._4_4_ = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
  }
  capnp::_::PointerReader::getList(&local_60,&local_a8,INLINE_COMPOSITE,(word *)0x0);
  this_00 = (BrandScope *)operator_new(0x50);
  BrandScope::BrandScope
            (this_00,errorReporter,(uint64_t)startingScopeId,local_60.elementCount,resolver);
  puVar1 = &(this_00->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (this->localBrand).disposer = (Disposer *)this_00;
  (this->localBrand).ptr = this_00;
  pCVar3 = (wipNodeParam->builder).capTable;
  (this->wipNode).builder.segment = (wipNodeParam->builder).segment;
  (this->wipNode).builder.capTable = pCVar3;
  (this->wipNode).builder.location = (wipNodeParam->builder).location;
  (this->wipNode).builder.tag.content = (wipNodeParam->builder).tag.content;
  (wipNodeParam->builder).segment = (SegmentBuilder *)0x0;
  (wipNodeParam->builder).location = (word *)0x0;
  capnp::_::OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_138,(this->orphanage).arena,(this->orphanage).capTable,
             (StructSize)0x20001);
  (this->sourceInfo).builder.segment = (SegmentBuilder *)local_138.capTable;
  (this->sourceInfo).builder.capTable = (CapTableBuilder *)local_138.data;
  (this->sourceInfo).builder.location = (word *)local_138.pointers;
  (this->sourceInfo).builder.tag.content = (uint64_t)local_138.segment;
  (this->groups).builder.endPtr = (AuxNode *)0x0;
  (this->groups).builder.ptr = (AuxNode *)0x0;
  (this->groups).builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
  (this->paramStructs).builder.ptr = (AuxNode *)0x0;
  (this->paramStructs).builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
  (this->paramStructs).builder.endPtr = (AuxNode *)0x0;
  (this->unfinishedValues).builder.ptr = (UnfinishedValue *)0x0;
  (this->unfinishedValues).builder.pos =
       (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
  (this->unfinishedValues).builder.endPtr = (UnfinishedValue *)0x0;
  local_108 = (decl->_reader).segment;
  pCStack_100 = (decl->_reader).capTable;
  local_f8 = (decl->_reader).data;
  pWStack_f0 = (decl->_reader).pointers;
  local_e8._0_4_ = (decl->_reader).dataSize;
  local_e8._4_2_ = (decl->_reader).pointerCount;
  local_e8._6_2_ = *(undefined2 *)&(decl->_reader).field_0x26;
  uStack_e0 = *(undefined8 *)&(decl->_reader).nestingLimit;
  capnp::_::OrphanBuilder::asStruct(&local_d0,&(this->wipNode).builder,(StructSize)0x60005);
  decl_00._reader.capTable = pCStack_100;
  decl_00._reader.segment = local_108;
  decl_00._reader.data = local_f8;
  decl_00._reader.pointers = pWStack_f0;
  decl_00._reader.dataSize = (undefined4)local_e8;
  decl_00._reader.pointerCount = local_e8._4_2_;
  decl_00._reader._38_2_ = local_e8._6_2_;
  decl_00._reader._40_8_ = uStack_e0;
  builder._builder.capTable = local_d0.capTable;
  builder._builder.segment = local_d0.segment;
  builder._builder.data = local_d0.data;
  builder._builder.pointers = local_d0.pointers;
  builder._builder.dataSize = local_d0.dataSize;
  builder._builder.pointerCount = local_d0.pointerCount;
  builder._builder._38_2_ = local_d0._38_2_;
  compileNode(this,decl_00,builder);
  return;
}

Assistant:

NodeTranslator::NodeTranslator(
    Resolver& resolver, ErrorReporter& errorReporter,
    const Declaration::Reader& decl, Orphan<schema::Node> wipNodeParam,
    bool compileAnnotations)
    : resolver(resolver), errorReporter(errorReporter),
      orphanage(Orphanage::getForMessageContaining(wipNodeParam.get())),
      compileAnnotations(compileAnnotations),
      localBrand(kj::refcounted<BrandScope>(
          errorReporter, wipNodeParam.getReader().getId(),
          decl.getParameters().size(), resolver)),
      wipNode(kj::mv(wipNodeParam)),
      sourceInfo(orphanage.newOrphan<schema::Node::SourceInfo>()) {
  compileNode(decl, wipNode.get());
}